

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O1

void inven_takeoff(object *obj)

{
  equip_slot **ppeVar1;
  uint16_t uVar2;
  player_upkeep *ppVar3;
  player *p;
  char cVar4;
  wchar_t wVar5;
  artifact_set *set;
  equip_slot **ppeVar6;
  char *pcVar7;
  char o_name [80];
  char local_78 [88];
  
  wVar5 = equipped_item_slot(player->body,obj);
  if (wVar5 != (uint)(player->body).count) {
    if (obj->artifact != (artifact *)0x0) {
      set = check_sets(obj->artifact);
      if (set != (artifact_set *)0x0) {
        remove_set(set);
      }
    }
    object_desc(local_78,0x50,obj,0x43,player);
    ppeVar1 = &(player->body).slots;
    ppeVar6 = &bodies->slots;
    if (player != (player *)0x0) {
      ppeVar6 = ppeVar1;
    }
    uVar2 = (*ppeVar6)[wVar5].type;
    if (uVar2 == 1) {
      pcVar7 = "You were wielding";
    }
    else if (uVar2 == 2) {
      pcVar7 = "You were holding";
    }
    else {
      pcVar7 = "You were wearing";
      if (uVar2 == 5) {
        pcVar7 = "You were holding";
      }
    }
    (*ppeVar1)[wVar5].obj = (object *)0x0;
    p = player;
    ppVar3 = player->upkeep;
    ppVar3->equip_cnt = ppVar3->equip_cnt + L'\xffffffff';
    ppVar3->update = ppVar3->update | 0x441;
    *(byte *)&ppVar3->notice = (byte)ppVar3->notice | 2;
    update_stuff(p);
    cVar4 = gear_to_label(player,obj);
    msgt(0x80,"%s %s (%c).",pcVar7,local_78,(ulong)(uint)(int)cVar4);
  }
  return;
}

Assistant:

void inven_takeoff(struct object *obj)
{
	int slot = equipped_item_slot(player->body, obj);
	const char *act;
	char o_name[80];

	/* Paranoia */
	if (slot == player->body.count) return;

	/* Check to see if a set item is being removed */
	if (obj->artifact) {
		struct artifact_set *set = check_sets(obj->artifact);
		if (set) {
			remove_set(set);
		}
	}

	/* Describe the object */
	object_desc(o_name, sizeof(o_name), obj, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Describe removal by slot */
	if (slot_type_is(player, slot, EQUIP_WEAPON))
		act = "You were wielding";
	else if (slot_type_is(player, slot, EQUIP_BOW))
		act = "You were holding";
	else if (slot_type_is(player, slot, EQUIP_LIGHT))
		act = "You were holding";
	else
		act = "You were wearing";

	/* De-equip the object */
	player->body.slots[slot].obj = NULL;
	player->upkeep->equip_cnt--;

	player->upkeep->update |= (PU_BONUS | PU_INVEN | PU_UPDATE_VIEW);
	player->upkeep->notice |= (PN_IGNORE);
	update_stuff(player);

	/* Message */
	msgt(MSG_WIELD, "%s %s (%c).", act, o_name, gear_to_label(player, obj));

	return;
}